

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

void __thiscall ipx::Iterate::ComputeObjectives(Iterate *this)

{
  bool bVar1;
  Int IVar2;
  Int IVar3;
  int iVar4;
  State SVar5;
  undefined4 extraout_var;
  Vector *this_00;
  Vector *this_01;
  double *pdVar6;
  void *extraout_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  double dVar7;
  double dVar8;
  Vector *y;
  Int j_2;
  Int j_1;
  Int j;
  SparseMatrix *AI;
  Vector *ub;
  Vector *lb;
  Vector *c;
  Vector *b;
  Int n;
  Int m;
  undefined4 in_stack_ffffffffffffff38;
  Int in_stack_ffffffffffffff3c;
  Iterate *in_stack_ffffffffffffff40;
  Vector *in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  SparseMatrix *in_stack_ffffffffffffff70;
  int local_44;
  int local_40;
  int local_3c;
  
  IVar2 = Model::rows((Model *)*in_RDI);
  IVar3 = Model::cols((Model *)*in_RDI);
  Model::b((Model *)*in_RDI);
  iVar4 = Model::c((Model *)*in_RDI,in_RSI,extraout_RDX);
  this_00 = Model::lb((Model *)*in_RDI);
  this_01 = Model::ub((Model *)*in_RDI);
  Model::AI((Model *)*in_RDI);
  if ((*(byte *)((long)in_RDI + 0x109) & 1) == 0) {
    in_RDI[0x1c] = 0;
    dVar7 = Model::offset((Model *)*in_RDI);
    in_RDI[0x18] = dVar7;
    for (local_40 = 0; local_40 < IVar3 + IVar2; local_40 = local_40 + 1) {
      SVar5 = StateOf((Iterate *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
      if (SVar5 == fixed) {
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)CONCAT44(extraout_var,iVar4),(long)local_40);
        dVar7 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_40);
        in_RDI[0x1c] = dVar7 * *pdVar6 + (double)in_RDI[0x1c];
      }
      else {
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)CONCAT44(extraout_var,iVar4),(long)local_40);
        dVar7 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_40);
        in_RDI[0x18] = dVar7 * *pdVar6 + (double)in_RDI[0x18];
      }
      bVar1 = is_implied(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      if (bVar1) {
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_40);
        in_stack_ffffffffffffff60 = (Vector *)*pdVar6;
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_40);
        in_stack_ffffffffffffff68 = (double)in_stack_ffffffffffffff60 - *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_40);
        in_RDI[0x18] = -in_stack_ffffffffffffff68 * *pdVar6 + (double)in_RDI[0x18];
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_40);
        in_stack_ffffffffffffff70 = (SparseMatrix *)*pdVar6;
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_40);
        dVar7 = (double)in_stack_ffffffffffffff70 - *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_40);
        in_RDI[0x1c] = dVar7 * *pdVar6 + (double)in_RDI[0x1c];
      }
    }
    y = (Vector *)Model::offset((Model *)*in_RDI);
    dVar7 = Dot(in_stack_ffffffffffffff60,y);
    in_RDI[0x19] = (double)y + dVar7;
    for (local_44 = 0; local_44 < IVar3 + IVar2; local_44 = local_44 + 1) {
      bVar1 = has_barrier_lb(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      if (bVar1) {
        pdVar6 = std::valarray<double>::operator[](this_00,(long)local_44);
        dVar7 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_44);
        in_RDI[0x19] = dVar7 * *pdVar6 + (double)in_RDI[0x19];
      }
      bVar1 = has_barrier_ub(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      if (bVar1) {
        pdVar6 = std::valarray<double>::operator[](this_01,(long)local_44);
        dVar7 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_44);
        in_RDI[0x19] = -dVar7 * *pdVar6 + (double)in_RDI[0x19];
      }
      SVar5 = StateOf((Iterate *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
      if (SVar5 == fixed) {
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_44);
        in_stack_ffffffffffffff40 = (Iterate *)*pdVar6;
        dVar7 = DotColumn(in_stack_ffffffffffffff70,(Int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                          in_stack_ffffffffffffff60);
        in_RDI[0x19] = -(double)in_stack_ffffffffffffff40 * dVar7 + (double)in_RDI[0x19];
      }
    }
  }
  else {
    in_RDI[0x1c] = 0;
    dVar7 = Model::offset((Model *)*in_RDI);
    dVar8 = Dot(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_RDI[0x18] = dVar7 + dVar8;
    dVar7 = Model::offset((Model *)*in_RDI);
    dVar8 = Dot(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_RDI[0x19] = dVar7 + dVar8;
    for (local_3c = 0; local_3c < IVar3 + IVar2; local_3c = local_3c + 1) {
      pdVar6 = std::valarray<double>::operator[](this_00,(long)local_3c);
      bVar1 = std::isfinite(*pdVar6);
      if (bVar1) {
        pdVar6 = std::valarray<double>::operator[](this_00,(long)local_3c);
        dVar7 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_3c);
        in_RDI[0x19] = dVar7 * *pdVar6 + (double)in_RDI[0x19];
      }
      pdVar6 = std::valarray<double>::operator[](this_01,(long)local_3c);
      bVar1 = std::isfinite(*pdVar6);
      if (bVar1) {
        pdVar6 = std::valarray<double>::operator[](this_01,(long)local_3c);
        dVar7 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_3c);
        in_RDI[0x19] = -dVar7 * *pdVar6 + (double)in_RDI[0x19];
      }
    }
  }
  return;
}

Assistant:

void Iterate::ComputeObjectives() const {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& b = model_.b();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    if (postprocessed_) {
        // Compute objective values as defined for the LP model.
        offset_ = 0.0;
        pobjective_ = model_.offset() + Dot(c, x_);
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                dobjective_ += lb[j] * zl_[j];
            if (std::isfinite(ub[j]))
                dobjective_ -= ub[j] * zu_[j];
        }
    } else {
        // Compute objective values for the LP that is solved at the very moment
        // (after fixing and implying variables). The offset is such that
        // pobjective_ + offset_ is the primal objective after postprocessing.
        offset_ = 0.0;
        pobjective_ = model_.offset();
        for (Int j = 0; j < n+m; j++) {
            if (StateOf(j) != State::fixed)
                pobjective_ += c[j] * x_[j];
            else
                offset_ += c[j] * x_[j];
            if (is_implied(j)) {
                // At the moment, we are solving an LP with the cost coefficient
                // for variable j decreased by zl[j]-zu[j].
                pobjective_ -= (zl_[j]-zu_[j]) * x_[j];
                offset_ += (zl_[j]-zu_[j]) * x_[j];
            }
        }
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (has_barrier_lb(j))
                dobjective_ += lb[j] * zl_[j];
            if (has_barrier_ub(j))
                dobjective_ -= ub[j] * zu_[j];
            if (StateOf(j) == State::fixed)
                // At the moment, we are solving the LP without variable j,
                // but with the RHS decreased by AI[:,j]*x[j].
                dobjective_ -= x_[j] * DotColumn(AI, j, y_);
        }
    }
}